

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cc
# Opt level: O2

void Minisat::limitMemory(uint64_t max_mem_mb)

{
  int iVar1;
  rlimit rl;
  
  if (max_mem_mb != 0) {
    getrlimit(RLIMIT_AS,(rlimit *)&rl);
    if ((max_mem_mb << 0x14 < rl.rlim_max) &&
       (rl.rlim_cur = max_mem_mb << 0x14, iVar1 = setrlimit(RLIMIT_AS,(rlimit *)&rl), iVar1 == -1))
    {
      puts("WARNING! Could not set resource limit: Virtual memory.");
    }
  }
  return;
}

Assistant:

void Minisat::limitMemory(uint64_t max_mem_mb)
{
// FIXME: OpenBSD does not support RLIMIT_AS. Not sure how well RLIMIT_DATA works instead.
#if defined(__OpenBSD__)
#define RLIMIT_AS RLIMIT_DATA
#endif

    // Set limit on virtual memory:
    if (max_mem_mb != 0){
        rlim_t new_mem_lim = (rlim_t)max_mem_mb * 1024*1024;
        rlimit rl;
        getrlimit(RLIMIT_AS, &rl);
        if (rl.rlim_max == RLIM_INFINITY || new_mem_lim < rl.rlim_max){
            rl.rlim_cur = new_mem_lim;
            if (setrlimit(RLIMIT_AS, &rl) == -1)
                printf("WARNING! Could not set resource limit: Virtual memory.\n");
        }
    }

#if defined(__OpenBSD__)
#undef RLIMIT_AS
#endif
}